

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void __thiscall
RegVmLoweredFunction::GetRegisters
          (RegVmLoweredFunction *this,SmallArray<unsigned_char,_32U> *result,VmValue *value)

{
  uint uVar1;
  uchar *val;
  uint i;
  uint index;
  VmValue *pVVar2;
  
  if ((value == (VmValue *)0x0) || (pVVar2 = value, value->typeID != 2)) {
    pVVar2 = (VmValue *)0x0;
  }
  CompleteUse(this,value);
  uVar1 = *(uint *)(pVVar2[1].users.little + 3);
  if (uVar1 != 0) {
    for (index = 0; index < uVar1; index = index + 1) {
      val = SmallArray<unsigned_char,_8U>::operator[]
                      ((SmallArray<unsigned_char,_8U> *)(pVVar2[1].users.little + 2),index);
      SmallArray<unsigned_char,_32U>::push_back(result,val);
      uVar1 = *(uint *)(pVVar2[1].users.little + 3);
    }
    return;
  }
  __assert_fail("!instruction->regVmRegisters.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                ,0xa4,
                "void RegVmLoweredFunction::GetRegisters(SmallArray<unsigned char, 32> &, VmValue *)"
               );
}

Assistant:

void RegVmLoweredFunction::GetRegisters(SmallArray<unsigned char, 32> &result, VmValue *value)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	CompleteUse(value);

	assert(!instruction->regVmRegisters.empty());

	for(unsigned i = 0; i < instruction->regVmRegisters.size(); i++)
		result.push_back(instruction->regVmRegisters[i]);
}